

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::initReferenceValues
          (TessellationShaderTessellationMaxInOut *this)

{
  int x;
  int y;
  int iVar1;
  GLfloat *pGVar2;
  ResourceError *this_00;
  int local_98;
  int local_94;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  GLfloat sumInTES [4];
  GLfloat sumInTCS [4];
  allocator<char> local_39;
  string local_38;
  int local_14;
  TessellationShaderTessellationMaxInOut *pTStack_10;
  int max_array_size;
  TessellationShaderTessellationMaxInOut *this_local;
  
  x = this->m_gl_max_tess_control_input_components_value;
  iVar1 = this->m_gl_max_tess_control_output_components_value;
  pTStack_10 = this;
  y = de::max<int>(this->m_gl_max_tess_evaluation_input_components_value,
                   this->m_gl_max_tess_evaluation_output_components_value);
  iVar1 = de::max<int>(iVar1,y);
  local_14 = de::max<int>(x,iVar1);
  pGVar2 = (GLfloat *)malloc((long)local_14 << 2);
  this->m_ref_vertex_attributes = pGVar2;
  if (this->m_ref_vertex_attributes == (GLfloat *)0x0) {
    this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unable to allocate memory!",&local_39);
    tcu::ResourceError::ResourceError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
  }
  memset(sumInTES + 2,0,0x10);
  memset(&i_1,0,0x10);
  for (i_2 = 0; i_2 < this->m_gl_max_tess_control_input_components_value + -4; i_2 = i_2 + 1) {
    this->m_ref_vertex_attributes[i_2] = (float)i_2;
  }
  for (i_3 = 0; i_3 < this->m_gl_max_tess_control_input_components_value + -4; i_3 = i_3 + 1) {
    sumInTES[(long)(i_3 % 4) + 2] =
         this->m_ref_vertex_attributes[i_3] + sumInTES[(long)(i_3 % 4) + 2];
  }
  for (i_4 = 0; i_4 < this->m_gl_max_tess_control_output_components_value + -4; i_4 = i_4 + 1) {
    this->m_ref_vertex_attributes[i_4] = sumInTES[(long)(i_4 % 4) + 2] + (float)i_4;
  }
  for (i_5 = this->m_gl_max_tess_control_input_components_value + -4;
      i_5 < this->m_gl_max_tess_control_output_components_value + -4; i_5 = i_5 + 1) {
    this->m_ref_vertex_attributes[i_5] = (float)i_5;
  }
  for (i_6 = 0; i_6 < this->m_gl_max_tess_evaluation_input_components_value + -4; i_6 = i_6 + 1) {
    (&i_1)[i_6 % 4] = (int)(this->m_ref_vertex_attributes[i_6] + (float)(&i_1)[i_6 % 4]);
  }
  for (i_7 = 0; i_7 < this->m_gl_max_tess_evaluation_output_components_value + -4; i_7 = i_7 + 1) {
    this->m_ref_vertex_attributes[i_7] = (float)(&i_1)[i_7 % 4] + (float)i_7;
  }
  for (local_94 = this->m_gl_max_tess_evaluation_input_components_value + -4;
      local_94 < this->m_gl_max_tess_evaluation_output_components_value + -4;
      local_94 = local_94 + 1) {
    this->m_ref_vertex_attributes[local_94] = (float)local_94;
  }
  this->m_ref_vertex_attributes[this->m_gl_max_tess_evaluation_output_components_value + -4] = 0.0;
  this->m_ref_vertex_attributes[this->m_gl_max_tess_evaluation_output_components_value + -3] = 0.0;
  this->m_ref_vertex_attributes[this->m_gl_max_tess_evaluation_output_components_value + -2] = 0.0;
  this->m_ref_vertex_attributes[this->m_gl_max_tess_evaluation_output_components_value + -1] = 1.0;
  this->m_ref_patch_attributes[0] = 0.0;
  this->m_ref_patch_attributes[1] = 0.0;
  this->m_ref_patch_attributes[2] = 0.0;
  this->m_ref_patch_attributes[3] = 0.0;
  for (local_98 = 0; local_98 < this->m_gl_max_tess_patch_components_value; local_98 = local_98 + 1)
  {
    this->m_ref_patch_attributes[local_98 % 4] =
         (float)local_98 + this->m_ref_patch_attributes[local_98 % 4];
  }
  return;
}

Assistant:

void TessellationShaderTessellationMaxInOut::initReferenceValues(void)
{
	/* Allocate vertex attribute array data needed for reference values preparation. */
	int max_array_size = de::max(m_gl_max_tess_control_input_components_value,
								 de::max(m_gl_max_tess_control_output_components_value,
										 de::max(m_gl_max_tess_evaluation_input_components_value,
												 m_gl_max_tess_evaluation_output_components_value)));

	m_ref_vertex_attributes = (glw::GLfloat*)malloc(sizeof(glw::GLfloat) * (max_array_size));
	if (m_ref_vertex_attributes == DE_NULL)
	{
		throw tcu::ResourceError("Unable to allocate memory!");
	}

	/* We need to create an array consisting of gl_max_tess_evaluation_output_components items.
	 * The array will be filled with the following values:
	 *
	 * reference_value[0],
	 * (...)
	 * reference_value[gl_max_tess_evaluation_output_components / 4 - 2],
	 * reference_gl_Position
	 *
	 * which corresponds to output block defined for Tessellation Evaluation Stage:
	 *
	 * out Vertex
	 * {
	 *     vec4 value[(gl_MaxTessControlInputComponents) / 4 - 1];
	 * } outVertex;
	 *
	 * + gl_Position.
	 */
	glw::GLfloat sumInTCS[] = { 0.0f, 0.0f, 0.0f, 0.0f };
	glw::GLfloat sumInTES[] = { 0.0f, 0.0f, 0.0f, 0.0f };

	for (int i = 0; i < m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	for (int i = 0; i < m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i++)
	{
		sumInTCS[i % 4 /* component selector */] += m_ref_vertex_attributes[i];
	}

	for (int i = 0; i < m_gl_max_tess_control_output_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = sumInTCS[i % 4] + (glw::GLfloat)i;
	}

	for (int i = m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i < m_gl_max_tess_control_output_components_value - 4;	/* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	for (int i = 0; i < m_gl_max_tess_evaluation_input_components_value - 4; /* gl_Position */
		 i++)
	{
		sumInTES[i % 4 /* component selector */] += m_ref_vertex_attributes[i];
	}

	for (int i = 0; i < m_gl_max_tess_evaluation_output_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = sumInTES[i % 4 /* component selector */] + (glw::GLfloat)i;
	}

	for (int i = m_gl_max_tess_evaluation_input_components_value - 4; /* gl_Position */
		 i < m_gl_max_tess_evaluation_output_components_value - 4;	/* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	/* Store gl_Position reference values (only first vertex will be compared) */
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 4] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 3] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 2] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 1] = 1.0f;

	/* Set up reference data for case 2
	 *
	 * Only one output vector will be needed for comparison.
	 */
	m_ref_patch_attributes[0] = 0.0f;
	m_ref_patch_attributes[1] = 0.0f;
	m_ref_patch_attributes[2] = 0.0f;
	m_ref_patch_attributes[3] = 0.0f;

	for (int i = 0; i < m_gl_max_tess_patch_components_value; i++)
	{
		m_ref_patch_attributes[i % 4] += (glw::GLfloat)i;
	}
}